

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool ON_Font::EqualFontFamily(ON_Font *lhs,ON_Font *rhs)

{
  bool bVar1;
  bool bVar2;
  ON_wString *src;
  ON_wString *pOVar3;
  ON_wString *pOVar4;
  ON_wString OStack_58;
  ON_wString local_50;
  ON_wString *local_48;
  ON_wString local_40;
  ON_wString local_38;
  
  if (rhs == (ON_Font *)0x0 || lhs == (ON_Font *)0x0) {
LAB_0047f4ca:
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (lhs == rhs) {
      return true;
    }
    pOVar3 = &rhs->m_en_family_name;
    bVar1 = Internal_EqualName(&lhs->m_en_family_name,pOVar3);
    if (bVar1) {
      return true;
    }
    bVar1 = ON_wString::IsNotEmpty(&lhs->m_loc_family_name);
    pOVar4 = &lhs->m_en_family_name;
    if (bVar1) {
      pOVar4 = &lhs->m_loc_family_name;
    }
    ON_wString::ON_wString(&local_50,pOVar4);
    pOVar4 = &rhs->m_loc_family_name;
    bVar1 = ON_wString::IsNotEmpty(pOVar4);
    src = pOVar3;
    if (bVar1) {
      src = pOVar4;
    }
    ON_wString::ON_wString(&OStack_58,src);
    bVar1 = Internal_EqualName(&local_50,&OStack_58);
    ON_wString::~ON_wString(&OStack_58);
    ON_wString::~ON_wString(&local_50);
    if (bVar1) {
      return true;
    }
    local_48 = pOVar4;
    bVar1 = ON_wString::IsNotEmpty(&lhs->m_loc_face_name);
    pOVar4 = &lhs->m_en_face_name;
    if (bVar1) {
      pOVar4 = &lhs->m_loc_face_name;
    }
    ON_wString::ON_wString(&local_50,pOVar4);
    bVar1 = ON_wString::IsNotEmpty(&local_50);
    pOVar4 = local_48;
    if (bVar1) {
      bVar1 = ON_wString::IsNotEmpty(local_48);
      if (bVar1) {
        pOVar3 = pOVar4;
      }
      ON_wString::ON_wString(&OStack_58,pOVar3);
      bVar1 = ON_wString::IsNotEmpty(&OStack_58);
      ON_wString::~ON_wString(&OStack_58);
      ON_wString::~ON_wString(&local_50);
      if (bVar1) goto LAB_0047f4ca;
    }
    else {
      ON_wString::~ON_wString(&local_50);
    }
    bVar1 = Internal_EqualName(&lhs->m_en_postscript_name,&rhs->m_en_postscript_name);
    if (!bVar1) {
      local_48 = &rhs->m_en_windows_logfont_name;
      bVar1 = Internal_EqualName(&lhs->m_en_windows_logfont_name,local_48);
      if (!bVar1) {
        bVar2 = ON_wString::IsNotEmpty(&lhs->m_loc_postscript_name);
        pOVar3 = &lhs->m_en_postscript_name;
        if (bVar2) {
          pOVar3 = &lhs->m_loc_postscript_name;
        }
        ON_wString::ON_wString(&local_50,pOVar3);
        bVar2 = ON_wString::IsNotEmpty(&rhs->m_loc_postscript_name);
        pOVar3 = &rhs->m_en_postscript_name;
        if (bVar2) {
          pOVar3 = &rhs->m_loc_postscript_name;
        }
        ON_wString::ON_wString(&OStack_58,pOVar3);
        bVar1 = Internal_EqualName(&local_50,&OStack_58);
        bVar2 = true;
        if (!bVar1) {
          bVar2 = ON_wString::IsNotEmpty(&lhs->m_loc_windows_logfont_name);
          pOVar3 = &lhs->m_en_windows_logfont_name;
          if (bVar2) {
            pOVar3 = &lhs->m_loc_windows_logfont_name;
          }
          ON_wString::ON_wString(&local_38,pOVar3);
          bVar2 = ON_wString::IsNotEmpty(&rhs->m_loc_windows_logfont_name);
          pOVar3 = local_48;
          if (bVar2) {
            pOVar3 = &rhs->m_loc_windows_logfont_name;
          }
          ON_wString::ON_wString(&local_40,pOVar3);
          bVar2 = Internal_EqualName(&local_38,&local_40);
          ON_wString::~ON_wString(&local_40);
          ON_wString::~ON_wString(&local_38);
        }
        ON_wString::~ON_wString(&OStack_58);
        ON_wString::~ON_wString(&local_50);
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_Font::EqualFontFamily(
  const ON_Font* lhs,
  const ON_Font* rhs
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs == rhs)
    return true;

  if (Internal_EqualName(lhs->m_en_family_name, rhs->m_en_family_name))
    return true;
  if (Internal_EqualName(lhs->FamilyName(ON_Font::NameLocale::LocalizedFirst), rhs->FamilyName(ON_Font::NameLocale::LocalizedFirst)))
    return true;
  if (lhs->FaceName().IsNotEmpty() && rhs->FamilyName().IsNotEmpty())
    return false; // both lhs and rhs have non-empty family names.

  // Testing PostScript, and LOGFONT names handles cases where the family name is missing.
  const bool rc
    = Internal_EqualName(lhs->m_en_postscript_name, rhs->m_en_postscript_name)
    || Internal_EqualName(lhs->m_en_windows_logfont_name, rhs->m_en_windows_logfont_name)
    || Internal_EqualName(lhs->PostScriptName(ON_Font::NameLocale::LocalizedFirst),rhs->PostScriptName(ON_Font::NameLocale::LocalizedFirst))
    || Internal_EqualName(lhs->WindowsLogfontName(ON_Font::NameLocale::LocalizedFirst),rhs->WindowsLogfontName(ON_Font::NameLocale::LocalizedFirst))
    ;
  return rc;
}